

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_long,unsigned_long(*&)(unsigned_long,unsigned_long)>
          (Memory *this,u64 offset,u64 addend,unsigned_long rhs,
          BinopFunc<unsigned_long,_unsigned_long> **func,unsigned_long *out)

{
  unsigned_long addend_00;
  u64 offset_00;
  bool bVar1;
  Result RVar2;
  unsigned_long val;
  unsigned_long local_48;
  unsigned_long lhs;
  unsigned_long *out_local;
  BinopFunc<unsigned_long,_unsigned_long> **func_local;
  unsigned_long rhs_local;
  u64 addend_local;
  u64 offset_local;
  Memory *this_local;
  
  lhs = (unsigned_long)out;
  out_local = (unsigned_long *)func;
  func_local = (BinopFunc<unsigned_long,_unsigned_long> **)rhs;
  rhs_local = addend;
  addend_local = offset;
  offset_local = (u64)this;
  RVar2 = AtomicLoad<unsigned_long>(this,offset,addend,&local_48);
  bVar1 = Failed(RVar2);
  offset_00 = addend_local;
  addend_00 = rhs_local;
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    val = (*(code *)*out_local)(local_48,func_local);
    RVar2 = AtomicStore<unsigned_long>(this,offset_00,addend_00,val);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      *(unsigned_long *)lhs = local_48;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}